

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_is_quad_uniform_control_flow(Impl *this,SPIRVModule *module)

{
  Builder *pBVar1;
  Vector<Id> *this_00;
  Set<spv::Capability> *this_01;
  Block *pBVar2;
  Instruction *pIVar3;
  Impl *pIVar4;
  Id IVar5;
  Id IVar6;
  Id IVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *instruction;
  Instruction *instruction_00;
  uint *puVar10;
  Instruction *raw_instruction_5;
  Id IVar11;
  Instruction *raw_instruction;
  iterator iVar12;
  Instruction *raw_instruction_6;
  Instruction *raw_instruction_4;
  Instruction *raw_instruction_7;
  Block *entry;
  Vector<Id> local_f8;
  Block *local_d8;
  Instruction *local_d0;
  Instruction *local_c8;
  Builder *local_c0;
  Impl *local_b8;
  Capability local_b0;
  Id local_ac;
  Instruction *local_a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  _Head_base<0UL,_spv::Instruction_*,_false> local_80;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  Instruction *local_60;
  Function *local_58;
  Block *local_50;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  if (this->is_quad_uniform_call_id != 0) {
    return this->is_quad_uniform_call_id;
  }
  pBVar1 = &this->builder;
  local_50 = (this->builder).buildPoint;
  local_d8 = (Block *)0x0;
  local_b8 = this;
  IVar5 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
  IVar6 = spv::Builder::makeVectorType(pBVar1,IVar5,4);
  local_ac = spv::Builder::makeBoolType(pBVar1);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = spv::Builder::makeFunctionEntry
                       (pBVar1,DecorationMax,local_ac,"IsQuadUniformControlFlow",&local_f8,&local_48
                        ,&local_d8);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_48);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pIVar4 = local_b8;
  IVar11 = (local_b8->builder).uniqueId + 1;
  (local_b8->builder).uniqueId = IVar11;
  pIVar8 = (Instruction *)allocate_in_thread(0x38);
  pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar8->resultId = IVar11;
  pIVar8->typeId = IVar6;
  pIVar8->opCode = OpGroupNonUniformBallot;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar8->block = (Block *)0x0;
  IVar11 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
  IVar11 = spv::Builder::makeIntConstant(pBVar1,IVar11,3,false);
  iVar12._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = IVar11;
  if (iVar12._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current = IVar11;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeBoolConstant(pBVar1,true,false);
  iVar12._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8 = pIVar8;
  if (iVar12._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar11 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
  IVar11 = spv::Builder::makeIntConstant(pBVar1,IVar11,2,false);
  IVar7 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
  IVar7 = spv::Builder::makeIntConstant(pBVar1,IVar7,1,false);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x10);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 4;
  *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = IVar11;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = IVar11;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = IVar11;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = IVar11;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  IVar11 = spv::Builder::makeCompositeConstant(pBVar1,IVar6,&local_f8,false);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x10);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 4;
  *local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = IVar7;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = IVar7;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = IVar7;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = IVar7;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0 = pBVar1;
  local_b0 = spv::Builder::makeCompositeConstant(pBVar1,IVar6,&local_f8,false);
  if (local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_f8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  IVar7 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar7;
  pIVar8 = (Instruction *)allocate_in_thread(0x38);
  pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar8->resultId = IVar7;
  pIVar8->typeId = IVar6;
  pIVar8->opCode = OpShiftRightLogical;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_c8->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar8->operands,
             (iterator)0x0,(uint *)&local_f8);
  iVar12._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d0 = (Instruction *)CONCAT44(local_d0._4_4_,IVar6);
  if (iVar12._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = IVar11;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current = IVar11;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
    local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = IVar11;
  }
  IVar6 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar6;
  pIVar9 = (Instruction *)allocate_in_thread(0x38);
  pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar9->resultId = IVar6;
  pIVar9->typeId = (Id)local_d0;
  pIVar9->opCode = OpBitwiseOr;
  (pIVar9->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar9->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_c8->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar9->operands,
             (iterator)0x0,(uint *)&local_f8);
  iVar12._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar8->resultId;
  local_60 = pIVar8;
  if (iVar12._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar6 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar6;
  pIVar8 = (Instruction *)allocate_in_thread(0x38);
  pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar8->resultId = IVar6;
  pIVar8->typeId = (Id)local_d0;
  pIVar8->opCode = OpShiftRightLogical;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar8->operands,
             (iterator)0x0,(uint *)&local_f8);
  iVar12._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_b0;
  local_a8 = pIVar9;
  if (iVar12._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current = local_b0;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar6 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar6;
  pIVar9 = (Instruction *)allocate_in_thread(0x38);
  pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar9->resultId = IVar6;
  pIVar9->typeId = (Id)local_d0;
  pIVar9->opCode = OpBitwiseOr;
  (pIVar9->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar9->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_a8->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar9->operands,
             (iterator)0x0,(uint *)&local_f8);
  iVar12._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar8->resultId;
  local_d0 = pIVar8;
  if (iVar12._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar6 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar6;
  pIVar8 = (Instruction *)allocate_in_thread(0x38);
  pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar8->resultId = IVar6;
  pIVar8->typeId = IVar5;
  pIVar8->opCode = OpLoad;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       get_builtin_shader_input(pIVar4,BuiltInSubgroupLocalInvocationId);
  iVar12._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar6 = (pIVar4->builder).uniqueId + 1;
  (pIVar4->builder).uniqueId = IVar6;
  instruction = (Instruction *)allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = IVar6;
  instruction->typeId = IVar5;
  instruction->opCode = OpBitwiseAnd;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar8->resultId;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
             &instruction->operands,(iterator)0x0,(uint *)&local_f8);
  pBVar1 = local_c0;
  IVar5 = spv::Builder::makeIntegerType(local_c0,0x20,false);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       spv::Builder::makeIntConstant(pBVar1,IVar5,0xfffffffc,false);
  iVar12._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &instruction->operands,iVar12,(uint *)&local_f8);
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  IVar5 = (local_b8->builder).uniqueId + 1;
  (local_b8->builder).uniqueId = IVar5;
  instruction_00 = (Instruction *)allocate_in_thread(0x38);
  pBVar1 = local_c0;
  instruction_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction_00->resultId = IVar5;
  instruction_00->typeId = local_ac;
  instruction_00->opCode = OpGroupNonUniformBallotBitExtract;
  this_00 = &instruction_00->operands;
  (instruction_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(instruction_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  IVar5 = spv::Builder::makeIntegerType(local_c0,0x20,false);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(pBVar1,IVar5,3,false);
  iVar12._M_current =
       (instruction_00->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar10 = (instruction_00->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar12._M_current == puVar10) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar12,
               (uint *)&local_f8);
    iVar12._M_current =
         (instruction_00->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar10 = (instruction_00->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    iVar12._M_current = iVar12._M_current + 1;
    (instruction_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
  if (iVar12._M_current == puVar10) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar12,
               (uint *)&local_f8);
    iVar12._M_current =
         (instruction_00->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar10 = (instruction_00->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar12._M_current =
         (Id)local_f8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    iVar12._M_current = iVar12._M_current + 1;
    (instruction_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = instruction->resultId;
  if (iVar12._M_current == puVar10) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar12,
               (uint *)&local_f8);
  }
  else {
    *iVar12._M_current = instruction->resultId;
    (instruction_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  pIVar3 = local_c8;
  pBVar2 = local_d8;
  IVar5 = instruction_00->resultId;
  local_68._M_head_impl = local_c8;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
  pIVar3->block = pBVar2;
  if (pIVar3->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar3);
  }
  if (local_68._M_head_impl != (Instruction *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Instruction[1])();
  }
  pIVar3 = local_60;
  pBVar2 = local_d8;
  local_68._M_head_impl = (Instruction *)0x0;
  local_70._M_head_impl = local_60;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_70);
  pIVar3->block = pBVar2;
  if (pIVar3->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar3);
  }
  if (local_70._M_head_impl != (Instruction *)0x0) {
    (*(local_70._M_head_impl)->_vptr_Instruction[1])();
  }
  pIVar3 = local_a8;
  pBVar2 = local_d8;
  local_70._M_head_impl = (Instruction *)0x0;
  local_78._M_head_impl = local_a8;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_78);
  pIVar3->block = pBVar2;
  if (pIVar3->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar3);
  }
  if (local_78._M_head_impl != (Instruction *)0x0) {
    (*(local_78._M_head_impl)->_vptr_Instruction[1])();
  }
  pIVar3 = local_d0;
  pBVar2 = local_d8;
  local_78._M_head_impl = (Instruction *)0x0;
  local_80._M_head_impl = local_d0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_80);
  pIVar3->block = pBVar2;
  if (pIVar3->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar3);
  }
  if (local_80._M_head_impl != (Instruction *)0x0) {
    (*(local_80._M_head_impl)->_vptr_Instruction[1])();
  }
  pBVar2 = local_d8;
  local_80._M_head_impl = (Instruction *)0x0;
  local_88._M_head_impl = pIVar9;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_88);
  pIVar9->block = pBVar2;
  if (pIVar9->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar9);
  }
  if (local_88._M_head_impl != (Instruction *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Instruction[1])();
  }
  pBVar2 = local_d8;
  local_88._M_head_impl = (Instruction *)0x0;
  local_90._M_head_impl = pIVar8;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_90);
  pIVar4 = local_b8;
  pIVar8->block = pBVar2;
  if (pIVar8->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,pIVar8);
  }
  if (local_90._M_head_impl != (Instruction *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Instruction[1])();
  }
  pBVar2 = local_d8;
  local_90._M_head_impl = (Instruction *)0x0;
  local_98._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_98);
  instruction->block = pBVar2;
  if (instruction->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,instruction);
  }
  if (local_98._M_head_impl != (Instruction *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Instruction[1])();
  }
  pBVar2 = local_d8;
  local_98._M_head_impl = (Instruction *)0x0;
  local_a0._M_head_impl = instruction_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_d8->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_a0);
  pBVar1 = local_c0;
  instruction_00->block = pBVar2;
  if (instruction_00->resultId != 0) {
    spv::Module::mapInstruction(pBVar2->parent->parent,instruction_00);
  }
  if (local_a0._M_head_impl != (Instruction *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Instruction[1])();
  }
  local_a0._M_head_impl = (Instruction *)0x0;
  spv::Builder::makeReturn(pBVar1,false,IVar5);
  (pIVar4->builder).buildPoint = local_50;
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x40;
  this_01 = &(pIVar4->builder).capabilities;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)this_01,(Capability *)&local_f8);
  local_f8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)this_01,(Capability *)&local_f8);
  IVar5 = (local_58->functionInstruction).resultId;
  pIVar4->is_quad_uniform_call_id = IVar5;
  return IVar5;
}

Assistant:

spv::Id SPIRVModule::Impl::build_is_quad_uniform_control_flow(SPIRVModule &module)
{
	if (is_quad_uniform_call_id)
		return is_quad_uniform_call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, bool_type,
	                                       "IsQuadUniformControlFlow",
	                                       {}, {}, &entry);

	auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
	ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	ballot_op->addIdOperand(builder.makeBoolConstant(true));

	spv::Id uint_2 = builder.makeUintConstant(2);
	spv::Id uint_1 = builder.makeUintConstant(1);
	uint_2 = builder.makeCompositeConstant(uvec4_type, { uint_2, uint_2, uint_2, uint_2 });
	uint_1 = builder.makeCompositeConstant(uvec4_type, { uint_1, uint_1, uint_1, uint_1 });

	auto shift_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_2->addIdOperand(ballot_op->getResultId());
	shift_2->addIdOperand(uint_2);
	auto or_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_2->addIdOperand(ballot_op->getResultId());
	or_2->addIdOperand(shift_2->getResultId());
	auto shift_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_1->addIdOperand(or_2->getResultId());
	shift_1->addIdOperand(uint_1);
	auto or_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_1->addIdOperand(or_2->getResultId());
	or_1->addIdOperand(shift_1->getResultId());

	auto load_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
	load_invocation_id->addIdOperand(get_builtin_shader_input(spv::BuiltInSubgroupLocalInvocationId));

	auto and_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
	and_invocation_id->addIdOperand(load_invocation_id->getResultId());
	and_invocation_id->addIdOperand(builder.makeUintConstant(~3u));

	auto extract_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformBallotBitExtract);
	extract_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	extract_op->addIdOperand(or_1->getResultId());
	extract_op->addIdOperand(and_invocation_id->getResultId());
	spv::Id result_id = extract_op->getResultId();

	entry->addInstruction(std::move(ballot_op));
	entry->addInstruction(std::move(shift_2));
	entry->addInstruction(std::move(or_2));
	entry->addInstruction(std::move(shift_1));
	entry->addInstruction(std::move(or_1));
	entry->addInstruction(std::move(load_invocation_id));
	entry->addInstruction(std::move(and_invocation_id));
	entry->addInstruction(std::move(extract_op));

	builder.makeReturn(false, result_id);
	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniform);

	is_quad_uniform_call_id = func->getId();
	return is_quad_uniform_call_id;
}